

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_beam.cpp
# Opt level: O2

bool __thiscall
ON_V5ExtrusionDisplayMeshCache::DeleteAfterRead
          (ON_V5ExtrusionDisplayMeshCache *this,ON_BinaryArchive *archive,ON_Object *parent_object)

{
  ON_Extrusion *pOVar1;
  ON_UUID mesh_id;
  ON_UUID mesh_id_00;
  
  pOVar1 = ON_Extrusion::Cast(parent_object);
  if (pOVar1 != (ON_Extrusion *)0x0) {
    if ((this->m_analysis_mesh).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      mesh_id.Data4[0] = 0xa4;
      mesh_id.Data4[1] = 0xc9;
      mesh_id.Data4[2] = '\x06';
      mesh_id.Data4[3] = 200;
      mesh_id.Data4[4] = '[';
      mesh_id.Data4[5] = '\x7f';
      mesh_id.Data4[6] = 0xf5;
      mesh_id.Data4[7] = '|';
      mesh_id.Data1 = 0xac12f955;
      mesh_id.Data2 = 0xa29f;
      mesh_id.Data3 = 0x437b;
      ON_MeshCache::SetMesh(&pOVar1->m_mesh_cache,mesh_id,&this->m_analysis_mesh);
    }
    if ((this->m_render_mesh).super___shared_ptr<ON_Mesh,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      mesh_id_00.Data4[0] = 0xb8;
      mesh_id_00.Data4[1] = 0xa1;
      mesh_id_00.Data4[2] = 'f';
      mesh_id_00.Data4[3] = 0xeb;
      mesh_id_00.Data4[4] = '\'';
      mesh_id_00.Data4[5] = 'J';
      mesh_id_00.Data4[6] = '_';
      mesh_id_00.Data4[7] = 0x91;
      mesh_id_00.Data1 = 0xf5e3baa9;
      mesh_id_00.Data2 = 0xa7a2;
      mesh_id_00.Data3 = 0x49fd;
      ON_MeshCache::SetMesh(&pOVar1->m_mesh_cache,mesh_id_00,&this->m_render_mesh);
    }
  }
  return true;
}

Assistant:

bool ON_V5ExtrusionDisplayMeshCache::DeleteAfterRead(
  const class ON_BinaryArchive& archive,
  class ON_Object* parent_object
  ) const
{
  ON_Extrusion* extrusion = ON_Extrusion::Cast(parent_object);
  if (nullptr != extrusion)
  {
    if ( nullptr != m_analysis_mesh.get() )
      extrusion->m_mesh_cache.SetMesh(ON_MeshCache::AnalysisMeshId, m_analysis_mesh);
    if ( nullptr != m_render_mesh.get() )
      extrusion->m_mesh_cache.SetMesh(ON_MeshCache::RenderMeshId, m_render_mesh);
  }
  return true;
}